

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O1

void __thiscall mp::BasicSolver::Print(BasicSolver *this,CStringRef format,ArgList *args)

{
  OutputHandler *pOVar1;
  size_t sVar2;
  MemoryWriter w;
  BasicWriter<char> local_250;
  Buffer<char> local_240;
  char local_220 [504];
  
  local_250.buffer_ = &local_240;
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_005c2730;
  local_240.size_ = 0;
  local_240.capacity_ = 500;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
  local_240.ptr_ = local_220;
  fmt::BasicWriter<char>::write
            (&local_250,(int)format.data_,(void *)args->types_,(size_t)args->field_1);
  pOVar1 = this->output_handler_;
  sVar2 = (local_250.buffer_)->size_;
  if ((local_250.buffer_)->capacity_ < sVar2 + 1) {
    (**(local_250.buffer_)->_vptr_Buffer)();
  }
  (local_250.buffer_)->ptr_[sVar2] = '\0';
  (*pOVar1->_vptr_OutputHandler[2])(pOVar1,(local_250.buffer_)->ptr_);
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_005c2730;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
  if (local_240.ptr_ != local_220) {
    operator_delete(local_240.ptr_,local_240.capacity_);
  }
  return;
}

Assistant:

void Print(fmt::CStringRef format, const fmt::ArgList &args) {
    fmt::MemoryWriter w;
    w.write(format, args);
    output_handler_->HandleOutput(w.c_str());
  }